

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O3

basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::
json_type_traits<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_void>
::to_json(json_type_traits<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_void>
          *this,pair<bool,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *val)

{
  void *pvVar1;
  undefined8 extraout_RDX;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> bVar2;
  
  pvVar1 = operator_new(0x20);
  *(undefined8 *)((long)pvVar1 + 8) = 0;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0;
  *(undefined8 *)((long)pvVar1 + 0x18) = 0;
  *(undefined2 *)this = 0xe;
  *(void **)(this + 8) = pvVar1;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::reserve
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,2);
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::push_back<bool_const&>
            ((basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)this,&val->first);
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
  push_back<std::__cxx11::wstring_const&>
            ((basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)this,&val->second);
  bVar2.field_0.int64_.val_ = extraout_RDX;
  bVar2.field_0._0_8_ = this;
  return (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar2.field_0;
}

Assistant:

static Json to_json(const std::pair<T1,T2>& val)
        {
            Json j(json_array_arg);
            j.reserve(2);
            j.push_back(val.first);
            j.push_back(val.second);
            return j;
        }